

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

bool __thiscall
google::
sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::set_deleted(sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *this,iterator *it)

{
  bool bVar1;
  char *local_18;
  
  if (this->num_deleted == 0) {
    bVar1 = true;
  }
  else {
    local_18 = *(it->pos).col_current;
    bVar1 = sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
            ::KeyInfo::equals<char_const*,char_const*>
                      ((KeyInfo *)&this->key_info,&(this->key_info).delkey,&local_18);
    bVar1 = !bVar1;
  }
  *(it->pos).col_current = (this->key_info).delkey;
  return bVar1;
}

Assistant:

bool set_deleted(iterator& it) {
    check_use_deleted("set_deleted()");
    bool retval = !test_deleted(it);
    // &* converts from iterator to value-type.
    set_key(&(*it), key_info.delkey);
    return retval;
  }